

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_CopyInitState(Abc_Obj_t *pSrc,Abc_Obj_t *pDest)

{
  Flow_Data_t *pFVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pDest_local;
  Abc_Obj_t *pSrc_local;
  
  if (pManMR->fComputeInitState != 0) {
    iVar2 = Abc_ObjIsLatch(pSrc);
    if (iVar2 == 0) {
      __assert_fail("Abc_ObjIsLatch(pSrc)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                    ,0x30e,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pAVar4 = Abc_ObjFanin0(pDest);
    if (pAVar4 != pSrc) {
      __assert_fail("Abc_ObjFanin0(pDest) == pSrc",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                    ,0x30f,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
    }
    iVar2 = Abc_ObjFaninC0(pDest);
    if (iVar2 != 0) {
      __assert_fail("!Abc_ObjFaninC0(pDest)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                    ,0x310,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pFVar1 = pManMR->pDataArray;
    uVar3 = Abc_ObjId(pDest);
    *(ushort *)(pFVar1 + uVar3) = *(ushort *)(pFVar1 + uVar3) & 0xff9f;
    iVar2 = Abc_LatchIsInit0(pSrc);
    if (iVar2 == 0) {
      iVar2 = Abc_LatchIsInit1(pSrc);
      if (iVar2 != 0) {
        pFVar1 = pManMR->pDataArray;
        uVar3 = Abc_ObjId(pDest);
        *(ushort *)(pFVar1 + uVar3) = *(ushort *)(pFVar1 + uVar3) | 0x40;
      }
    }
    else {
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pDest);
      *(ushort *)(pFVar1 + uVar3) = *(ushort *)(pFVar1 + uVar3) | 0x20;
    }
    if (pManMR->fIsForward == 0) {
      pAVar4 = (Abc_Obj_t *)Abc_ObjData(pSrc);
      iVar2 = Abc_ObjIsPi(pAVar4);
      if (iVar2 == 0) {
        __assert_fail("Abc_ObjIsPi(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x31b,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
      }
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pDest);
      pFVar1[uVar3].field_1.pred = pAVar4;
    }
  }
  return;
}

Assistant:

void
Abc_FlowRetime_CopyInitState( Abc_Obj_t * pSrc, Abc_Obj_t * pDest ) {
  Abc_Obj_t *pObj;

  if (!pManMR->fComputeInitState) return;

  assert(Abc_ObjIsLatch(pSrc));
  assert(Abc_ObjFanin0(pDest) == pSrc);
  assert(!Abc_ObjFaninC0(pDest));

  FUNSET(pDest, INIT_CARE);
  if (Abc_LatchIsInit0(pSrc)) {
    FSET(pDest, INIT_0);
  } else if (Abc_LatchIsInit1(pSrc)) {
    FSET(pDest, INIT_1);  
  }
  
  if (!pManMR->fIsForward) {
    pObj = (Abc_Obj_t*)Abc_ObjData(pSrc);
    assert(Abc_ObjIsPi(pObj));
    FDATA(pDest)->pInitObj = pObj;
  }
}